

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void test_send_multiple_jobs_starting_with_close(void)

{
  bool bVar1;
  cio_buffered_stream *pcVar2;
  cio_buffered_stream_write_handler_t p_Var3;
  void *pvVar4;
  _Bool _Var5;
  cio_error cVar6;
  ulong uVar7;
  ulong uVar8;
  cio_write_buffer *pcVar9;
  size_t sVar10;
  cio_write_buffer wb;
  cio_write_buffer text_wbh;
  cio_write_buffer pong_wbh;
  cio_write_buffer ping_wbh;
  char buffer [125];
  cio_write_buffer local_138;
  cio_write_buffer local_118;
  cio_write_buffer local_f8;
  cio_write_buffer local_d8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined5 uStack_50;
  undefined3 local_4b;
  undefined5 uStack_48;
  undefined8 uStack_43;
  
  local_138.data.head.q_len = (size_t)&local_b8;
  uStack_b0 = 0;
  uStack_48 = 0;
  uStack_43 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_4b = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0x61;
  cio_buffered_stream_write_fake.custom_fake = bs_write_later;
  local_d8.data.head.q_len = 0;
  local_d8.data.element.length = 0;
  local_f8.data.head.q_len = 0;
  local_f8.data.element.length = 0;
  local_118.next = &local_138;
  local_138.data.element.length = 0x7d;
  local_118.data.head.q_len = 1;
  local_118.data.element.length = 0x7d;
  local_138.next = &local_118;
  local_138.prev = &local_118;
  local_118.prev = local_118.next;
  local_f8.next = &local_f8;
  local_f8.prev = &local_f8;
  local_d8.next = &local_d8;
  local_d8.prev = &local_d8;
  cVar6 = cio_websocket_close(ws,CIO_WEBSOCKET_CLOSE_NORMAL,(char *)0x0,write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar6,"Writing a close frame did not succeed!",0xb16,UNITY_DISPLAY_STYLE_INT);
  cVar6 = cio_websocket_write_ping(ws,&local_d8,write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar6,"Writing a ping frame did not succeed!",0xb18,UNITY_DISPLAY_STYLE_INT);
  cVar6 = cio_websocket_write_pong(ws,&local_f8,write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar6,"Writing a pong frame did not succeed!",0xb1a,UNITY_DISPLAY_STYLE_INT);
  uVar7 = 1;
  cVar6 = cio_websocket_write_message_first_chunk
                    (ws,local_118.data.element.length,&local_118,true,false,write_handler,
                     (void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar6,"Writing a text frame did not succeed!",0xb1c,UNITY_DISPLAY_STYLE_INT);
  pvVar4 = write_later_handler_context;
  p_Var3 = write_later_handler;
  pcVar2 = write_later_bs;
  cio_buffered_stream_write_fake.custom_fake = bs_write_ok;
  uVar8 = (write_later_buf->data).head.q_len;
  pcVar9 = write_later_buf;
  sVar10 = write_buffer_pos;
  if (uVar8 != 0) {
    do {
      pcVar9 = pcVar9->next;
      memcpy(write_buffer + sVar10,(pcVar9->data).element.field_0.const_data,
             (pcVar9->data).element.length);
      sVar10 = sVar10 + (pcVar9->data).element.length;
      bVar1 = uVar7 < uVar8;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar1);
  }
  write_buffer_pos = sVar10;
  (*p_Var3)(pcVar2,pvVar4,CIO_SUCCESS);
  UnityAssertEqualNumber
            (4,(ulong)write_handler_fake.call_count,"Write handler was not called",0xb22,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[0],
             "websocket parameter of write_handler not correct",0xb23,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[0] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0xb24);
  }
  UnityAssertEqualNumber
            (0,(long)write_handler_fake.arg2_history[3],"err parameter of write_handler not correct"
             ,0xb25,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[1],
             "websocket parameter of write_handler not correct",0xb26,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[1] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0xb27);
  }
  UnityAssertEqualNumber
            (-0x7d,(long)write_handler_fake.arg2_history[0],
             "err parameter of write_handler not correct",0xb28,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[2],
             "websocket parameter of write_handler not correct",0xb29,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[2] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0xb2a);
  }
  UnityAssertEqualNumber
            (-0x7d,(long)write_handler_fake.arg2_history[1],
             "err parameter of write_handler not correct",0xb2b,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[3],
             "websocket parameter of write_handler not correct",0xb2c,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[3] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0xb2d);
  }
  UnityAssertEqualNumber
            (-0x7d,(long)write_handler_fake.arg2_history[2],
             "err parameter of write_handler not correct",0xb2e,UNITY_DISPLAY_STYLE_INT);
  uVar8 = (ulong)on_error_fake.call_count;
  UnityAssertEqualNumber(0,uVar8,"error callback was called",0xb30,UNITY_DISPLAY_STYLE_INT);
  _Var5 = is_close_frame(1000,SUB81(uVar8,0));
  if (!_Var5) {
    UnityFail("Written close frame not correct",0xb32);
  }
  return;
}

Assistant:

static void test_send_multiple_jobs_starting_with_close(void)
{
	char buffer[125] = {'a'};

	cio_buffered_stream_write_fake.custom_fake = bs_write_later;

	struct cio_write_buffer ping_wbh;
	cio_write_buffer_head_init(&ping_wbh);
	struct cio_write_buffer pong_wbh;
	cio_write_buffer_head_init(&pong_wbh);
	struct cio_write_buffer text_wbh;
	cio_write_buffer_head_init(&text_wbh);

	struct cio_write_buffer wb;
	cio_write_buffer_element_init(&wb, buffer, sizeof(buffer));
	cio_write_buffer_queue_tail(&text_wbh, &wb);

	enum cio_error err = cio_websocket_close(ws, CIO_WEBSOCKET_CLOSE_NORMAL, NULL, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a close frame did not succeed!");
	err = cio_websocket_write_ping(ws, &ping_wbh, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a ping frame did not succeed!");
	err = cio_websocket_write_pong(ws, &pong_wbh, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a pong frame did not succeed!");
	err = cio_websocket_write_message_first_chunk(ws, cio_write_buffer_get_total_size(&text_wbh), &text_wbh, true, false, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a text frame did not succeed!");

	// Simulate write call over the eventloop
	cio_buffered_stream_write_fake.custom_fake = bs_write_ok;
	bs_write_ok(write_later_bs, write_later_buf, write_later_handler, write_later_handler_context);

	TEST_ASSERT_EQUAL_MESSAGE(4, write_handler_fake.call_count, "Write handler was not called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[0], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[0], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, write_handler_fake.arg2_history[3], "err parameter of write_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[1], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[1], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_OPERATION_ABORTED, write_handler_fake.arg2_history[0], "err parameter of write_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[2], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[2], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_OPERATION_ABORTED, write_handler_fake.arg2_history[1], "err parameter of write_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[3], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[3], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_OPERATION_ABORTED, write_handler_fake.arg2_history[2], "err parameter of write_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");

	TEST_ASSERT_TRUE_MESSAGE(is_close_frame(CIO_WEBSOCKET_CLOSE_NORMAL, true), "Written close frame not correct");
}